

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_device_uninit(ma_device *pDevice)

{
  long lVar1;
  ma_bool32 mVar2;
  undefined1 local_40 [8];
  ma_allocation_callbacks allocationCallbacks;
  ma_device *pDevice_local;
  
  allocationCallbacks.onFree = (_func_void_void_ptr_void_ptr *)pDevice;
  mVar2 = ma_device__is_initialized(pDevice);
  if (mVar2 != 0) {
    mVar2 = ma_device_is_started((ma_device *)allocationCallbacks.onFree);
    if (mVar2 != 0) {
      ma_device_stop((ma_device *)allocationCallbacks.onFree);
    }
    LOCK();
    *(undefined4 *)(allocationCallbacks.onFree + 0x10) = 0;
    UNLOCK();
    mVar2 = ma_context_is_backend_asynchronous(*(ma_context **)allocationCallbacks.onFree);
    if (mVar2 == 0) {
      ma_event_signal((ma_event *)(allocationCallbacks.onFree + 0x60));
      ma_thread_wait((ma_thread *)(allocationCallbacks.onFree + 0x198));
    }
    (**(code **)(*(long *)allocationCallbacks.onFree + 0xe8))(allocationCallbacks.onFree);
    ma_event_uninit((ma_event *)(allocationCallbacks.onFree + 0x130));
    ma_event_uninit((ma_event *)(allocationCallbacks.onFree + 200));
    ma_event_uninit((ma_event *)(allocationCallbacks.onFree + 0x60));
    ma_mutex_uninit((ma_mutex *)(allocationCallbacks.onFree + 0x30));
    if (((byte)allocationCallbacks.onFree[0x1ac] >> 3 & 1) != 0) {
      lVar1 = *(long *)allocationCallbacks.onFree;
      local_40 = *(undefined1 (*) [8])(lVar1 + 0x20);
      allocationCallbacks.pUserData = *(void **)(lVar1 + 0x28);
      allocationCallbacks.onMalloc = *(_func_void_ptr_size_t_void_ptr **)(lVar1 + 0x30);
      allocationCallbacks.onRealloc = *(_func_void_ptr_void_ptr_size_t_void_ptr **)(lVar1 + 0x38);
      ma_context_uninit(*(ma_context **)allocationCallbacks.onFree);
      ma__free_from_callbacks
                (*(void **)allocationCallbacks.onFree,(ma_allocation_callbacks *)local_40);
    }
    memset(allocationCallbacks.onFree,0,0x55d0);
  }
  return;
}

Assistant:

MA_API void ma_device_uninit(ma_device* pDevice)
{
    if (!ma_device__is_initialized(pDevice)) {
        return;
    }

    /* Make sure the device is stopped first. The backends will probably handle this naturally, but I like to do it explicitly for my own sanity. */
    if (ma_device_is_started(pDevice)) {
        ma_device_stop(pDevice);
    }

    /* Putting the device into an uninitialized state will make the worker thread return. */
    ma_device__set_state(pDevice, MA_STATE_UNINITIALIZED);

    /* Wake up the worker thread and wait for it to properly terminate. */
    if (!ma_context_is_backend_asynchronous(pDevice->pContext)) {
        ma_event_signal(&pDevice->wakeupEvent);
        ma_thread_wait(&pDevice->thread);
    }

    pDevice->pContext->onDeviceUninit(pDevice);

    ma_event_uninit(&pDevice->stopEvent);
    ma_event_uninit(&pDevice->startEvent);
    ma_event_uninit(&pDevice->wakeupEvent);
    ma_mutex_uninit(&pDevice->lock);

    if (pDevice->isOwnerOfContext) {
        ma_allocation_callbacks allocationCallbacks = pDevice->pContext->allocationCallbacks;

        ma_context_uninit(pDevice->pContext);
        ma__free_from_callbacks(pDevice->pContext, &allocationCallbacks);
    }

    MA_ZERO_OBJECT(pDevice);
}